

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

void __thiscall gvr::PLYElement::readData(PLYElement *this,streambuf *in)

{
  long *plVar1;
  undefined8 *puVar2;
  pointer pPVar3;
  ulong uVar4;
  pointer pPVar5;
  long lVar6;
  ulong uVar7;
  
  lVar6 = this->size;
  if (0 < lVar6) {
    pPVar5 = (this->list).
             super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (this->list).
             super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = 0;
    do {
      if (pPVar3 != pPVar5) {
        lVar6 = 0x30;
        uVar4 = 0;
        do {
          plVar1 = *(long **)((long)&pPVar5->enc + lVar6);
          (**(code **)(*plVar1 + 0x10))(plVar1,in);
          puVar2 = *(undefined8 **)((long)&(pPVar5->name)._M_dataplus._M_p + lVar6);
          if (puVar2 != (undefined8 *)0x0) {
            (**(code **)*puVar2)
                      (puVar2,uVar7 & 0xffffffff,*(undefined8 *)((long)&pPVar5->enc + lVar6));
          }
          uVar4 = uVar4 + 1;
          pPVar5 = (this->list).
                   super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar3 = (this->list).
                   super__Vector_base<gvr::(anonymous_namespace)::PLYProperty,_std::allocator<gvr::(anonymous_namespace)::PLYProperty>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar6 = lVar6 + 0x40;
        } while (uVar4 < (ulong)((long)pPVar3 - (long)pPVar5 >> 6));
        lVar6 = this->size;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < lVar6);
  }
  return;
}

Assistant:

void PLYElement::readData(std::streambuf *in)
{
  for (long i=0; i<size; i++)
  {
    for (size_t k=0; k<list.size(); k++)
    {
      list[k].readData(in, i);
    }
  }
}